

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O0

void __thiscall
ExampleNLFeeder::
FeedDefinedVariables<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::DefVarWriterFactory>
          (ExampleNLFeeder *this,int i,DefVarWriterFactory *dvw)

{
  bool bVar1;
  reference piVar2;
  SparseVectorWriter<int,_double> *in_RDX;
  ExampleNLFeeder *in_RDI;
  DefVarWriter DVar3;
  ExprArgWriter ew;
  SparseDblVecWriter linw;
  DefVarWriter dv;
  int lin_nnz;
  int dvar0;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  DefVarWriter *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  SparseVectorWriter<int,_double> *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *in_stack_ffffffffffffff70;
  SparseVectorWriter<int,_double> local_80 [2];
  int local_60;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *local_58;
  int local_50;
  int in_stack_ffffffffffffffb4;
  ExampleModel *in_stack_ffffffffffffffb8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  ExprArgWriter *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  ExampleModel *this_00;
  
  Model(in_RDI);
  ExampleModel::DefVarsInItem(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  this_00 = (ExampleModel *)&stack0xffffffffffffffc8;
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff38);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_40);
    in_stack_ffffffffffffff44 = *piVar2;
    Model(in_RDI);
    local_50 = CountNNZ<double[2]>((ExampleNLFeeder *)
                                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                   (double (*) [2])in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff48 = in_RDX;
    Model(in_RDI);
    in_stack_ffffffffffffff50 = in_stack_ffffffffffffff44 + 2;
    in_stack_ffffffffffffff54 = local_50;
    Model(in_RDI);
    DVar3 = mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
            DefVarWriterFactory::StartDefVar
                      ((DefVarWriterFactory *)in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20)
                       ,(int)in_RDI,
                       (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_58 = DVar3.nlw_;
    in_stack_ffffffffffffff64 = DVar3.nnzlin_;
    local_60 = in_stack_ffffffffffffff64;
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::DefVarWriter::
    GetLinExprWriter(in_stack_ffffffffffffff38);
    Model(in_RDI);
    WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,double>,2ul>
              ((ExampleNLFeeder *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,
               (double (*) [2])CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::DefVarWriter::
    GetExprWriter(in_stack_ffffffffffffff38);
    Model(in_RDI);
    ExampleModel::
    WriteDVarExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
              (this_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::ExprArgWriter::
    ~ExprArgWriter((ExprArgWriter *)&stack0xffffffffffffff70);
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
    SparseVectorWriter<int,_double>::~SparseVectorWriter(local_80);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_40);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void FeedDefinedVariables(int i, DefVarWriterFactory& dvw) {
    for (int dvar0: Model().DefVarsInItem(i)) {
      int lin_nnz = CountNNZ(Model().dvar_linpart[dvar0]);
      auto dv = dvw.StartDefVar(
            dvar0 + Model().n_var,  // index after direct vars
            lin_nnz, Model().dvar_name[dvar0]);
      /////////// Write the linear part:
      auto linw = dv.GetLinExprWriter();
      WriteDense2Sparse_Pure(linw,
                             Model().dvar_linpart[dvar0]);
      /////////// Write the expression tree:
      auto ew = dv.GetExprWriter();
      Model().WriteDVarExpr(dvar0, ew);
    }
  }